

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffsparser.cpp
# Opt level: O3

USTATUS __thiscall
FfsParser::parseCommonSectionHeader
          (FfsParser *this,UByteArray *section,UINT32 localOffset,UModelIndex *parent,
          UModelIndex *index,bool insertIntoTree)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  byte type;
  TreeModel *this_00;
  bool bVar3;
  UINT32 UVar4;
  USTATUS UVar5;
  uint uVar6;
  ulong uVar7;
  UINT8 *ffsSize;
  CBString info;
  UByteArray local_f0;
  UModelIndex parentVolumeIndex;
  UByteArray header;
  CBString local_98;
  CBString name;
  UByteArray body;
  UModelIndex local_48;
  
  if (((section->d)._M_string_length & 0xfffffffc) == 0) {
    UVar5 = 0x14;
  }
  else {
    TreeModel::findParentOfType(&parentVolumeIndex,this->model,parent,'A');
    if ((((parentVolumeIndex.r < 0) || (parentVolumeIndex.c < 0)) ||
        (parentVolumeIndex.m == (TreeModel *)0x0)) ||
       (bVar3 = TreeModel::hasEmptyParsingData(this->model,&parentVolumeIndex), bVar3)) {
      ffsSize = (UINT8 *)(section->d)._M_dataplus._M_p;
      uVar7 = 4;
    }
    else {
      TreeModel::parsingData(&header,this->model,&parentVolumeIndex);
      cVar2 = header.d._M_dataplus._M_p[0x19];
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)header.d._M_dataplus._M_p != &header.d.field_2) {
        operator_delete(header.d._M_dataplus._M_p);
      }
      ffsSize = (UINT8 *)(section->d)._M_dataplus._M_p;
      uVar7 = 4;
      if (cVar2 == '\x03') {
        UVar4 = uint24ToUint32(ffsSize);
        uVar7 = (ulong)((uint)(UVar4 == 0xffffff) * 4 + 4);
      }
    }
    UVar5 = 0x14;
    uVar6 = (uint)uVar7;
    if (uVar6 <= (uint)(section->d)._M_string_length) {
      type = ffsSize[3];
      UByteArray::left(&header,section,uVar6);
      UByteArray::mid(&body,section,uVar6,-1);
      sectionTypeToUString((CBString *)&local_f0,type);
      Bstrlib::CBString::CBString(&info," section");
      Bstrlib::CBString::operator+(&name,(CBString *)&local_f0,&info);
      Bstrlib::CBString::~CBString(&info);
      Bstrlib::CBString::~CBString((CBString *)&local_f0);
      uVar6 = (uint)(section->d)._M_string_length;
      usprintf(&info,"Type: %02Xh\nFull size: %Xh (%u)\nHeader size: %Xh (%u)\nBody size: %Xh (%u)",
               (ulong)type,(ulong)uVar6,(ulong)uVar6,uVar7,uVar7,
               (ulong)(uint)body.d._M_string_length,(ulong)(uint)body.d._M_string_length);
      if (insertIntoTree) {
        this_00 = this->model;
        Bstrlib::CBString::CBString(&local_98);
        paVar1 = &local_f0.d.field_2;
        local_f0.d._M_string_length = 0;
        local_f0.d.field_2._M_local_buf[0] = '\0';
        local_f0.d._M_dataplus._M_p = (pointer)paVar1;
        TreeModel::addItem(&local_48,this_00,localOffset,'C',type,&name,&local_98,&info,&header,
                           &body,&local_f0,Movable,parent,'\0');
        index->m = local_48.m;
        index->r = local_48.r;
        index->c = local_48.c;
        index->i = local_48.i;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0.d._M_dataplus._M_p != paVar1) {
          operator_delete(local_f0.d._M_dataplus._M_p);
        }
        Bstrlib::CBString::~CBString(&local_98);
      }
      Bstrlib::CBString::~CBString(&info);
      Bstrlib::CBString::~CBString(&name);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)body.d._M_dataplus._M_p != &body.d.field_2) {
        operator_delete(body.d._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)header.d._M_dataplus._M_p != &header.d.field_2) {
        operator_delete(header.d._M_dataplus._M_p);
      }
      UVar5 = 0;
    }
  }
  return UVar5;
}

Assistant:

USTATUS FfsParser::parseCommonSectionHeader(const UByteArray & section, const UINT32 localOffset, const UModelIndex & parent, UModelIndex & index, const bool insertIntoTree)
{
    // Check sanity
    if ((UINT32)section.size() < sizeof(EFI_COMMON_SECTION_HEADER)) {
        return U_INVALID_SECTION;
    }
    
    // Obtain required information from parent volume
    UINT8 ffsVersion = 2;
    UModelIndex parentVolumeIndex = model->findParentOfType(parent, Types::Volume);
    if (parentVolumeIndex.isValid() && model->hasEmptyParsingData(parentVolumeIndex) == false) {
        UByteArray data = model->parsingData(parentVolumeIndex);
        const VOLUME_PARSING_DATA* pdata = (const VOLUME_PARSING_DATA*)data.constData();
        ffsVersion = pdata->ffsVersion;
    }
    
    // Obtain header fields
    const EFI_COMMON_SECTION_HEADER* sectionHeader = (const EFI_COMMON_SECTION_HEADER*)(section.constData());
    UINT32 headerSize = sizeof(EFI_COMMON_SECTION_HEADER);
    if (ffsVersion == 3 && uint24ToUint32(sectionHeader->Size) == EFI_SECTION2_IS_USED)
        headerSize = sizeof(EFI_COMMON_SECTION_HEADER2);
    UINT8 type = sectionHeader->Type;
    
    // Check sanity again
    if ((UINT32)section.size() < headerSize) {
        return U_INVALID_SECTION;
    }
    
    UByteArray header = section.left(headerSize);
    UByteArray body = section.mid(headerSize);
    
    // Get info
    UString name = sectionTypeToUString(type) + UString(" section");
    UString info = usprintf("Type: %02Xh\nFull size: %Xh (%u)\nHeader size: %Xh (%u)\nBody size: %Xh (%u)",
                            type,
                            (UINT32)section.size(), (UINT32)section.size(),
                            headerSize, headerSize,
                            (UINT32)body.size(), (UINT32)body.size());
    
    // Add tree item
    if (insertIntoTree) {
        index = model->addItem(localOffset, Types::Section, type, name, UString(), info, header, body, UByteArray(), Movable, parent);
    }
    
    return U_SUCCESS;
}